

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  StringRef attribute;
  StringRef attribute_00;
  StringRef name;
  StringRef name_00;
  bool bVar1;
  OfType OVar2;
  OfType OVar3;
  size_type sVar4;
  AssertionResult *this_00;
  XmlWriter *this_01;
  AssertionResult *this_02;
  reference pMVar5;
  StringRef *this_03;
  AssertionResult *in_RSI;
  size_type in_RDI;
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  ReusableStringStream rss;
  ScopedElement e;
  string elementName;
  AssertionResult *result;
  Column *in_stack_fffffffffffffdb8;
  AssertionResult *in_stack_fffffffffffffdc0;
  StringRef *in_stack_fffffffffffffdc8;
  ReusableStringStream *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  XmlFormatting fmt;
  string *in_stack_fffffffffffffde0;
  XmlWriter *in_stack_fffffffffffffde8;
  AssertionResult *in_stack_fffffffffffffdf8;
  XmlWriter *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe18;
  string local_1d8 [20];
  XmlFormatting in_stack_fffffffffffffe3c;
  XmlWriter *in_stack_fffffffffffffe40;
  StringRef in_stack_fffffffffffffe48;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_180;
  AssertionResult *local_178;
  undefined1 local_169;
  StringRef local_168;
  undefined1 local_151;
  string local_150 [32];
  Column local_130;
  undefined1 local_e9;
  string local_e8 [48];
  StringRef local_b8;
  StringRef local_a8;
  string local_98 [48];
  StringRef local_68;
  string local_38 [32];
  AssertionResult *local_18;
  AssertionResult *local_10;
  
  fmt = (XmlFormatting)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RSI;
  bVar1 = AssertionResult::isOk(in_stack_fffffffffffffdc0);
  if ((bVar1) && (OVar2 = AssertionResult::getResultType(local_18), OVar2 != ExplicitSkip)) {
    return;
  }
  std::__cxx11::string::string(local_38);
  OVar2 = AssertionResult::getResultType(local_18);
  if (3 < (uint)(OVar2 + Info)) {
    if (OVar2 == ExplicitSkip) {
      std::__cxx11::string::operator=(local_38,"skipped");
      goto LAB_001a8819;
    }
    if (OVar2 != FailureBit) {
      if ((uint)(OVar2 + ~FailureBit) < 2) {
LAB_001a87d1:
        std::__cxx11::string::operator=(local_38,"failure");
        goto LAB_001a8819;
      }
      if (OVar2 != Exception) {
        if (OVar2 != ThrewException) {
          if (OVar2 == DidntThrowException) goto LAB_001a87d1;
          if (OVar2 != FatalErrorCondition) goto LAB_001a8819;
        }
        std::__cxx11::string::operator=(local_38,"error");
        goto LAB_001a8819;
      }
    }
  }
  std::__cxx11::string::operator=(local_38,"internalError");
LAB_001a8819:
  sVar4 = in_RDI + 0xb0;
  operator|(Newline,Indent);
  XmlWriter::scopedElement(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,fmt);
  this_00 = (AssertionResult *)(in_RDI + 0xb0);
  local_68 = operator____sr((char *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  AssertionResult::getExpression_abi_cxx11_(in_stack_fffffffffffffdf8);
  StringRef::StringRef((StringRef *)in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8);
  name.m_start._4_4_ = OVar2;
  name.m_start._0_4_ = in_stack_fffffffffffffe18;
  name.m_size = in_RDI;
  attribute.m_size = sVar4;
  attribute.m_start = (char *)this_00;
  XmlWriter::writeAttribute(in_stack_fffffffffffffe00,name,attribute);
  std::__cxx11::string::~string(local_98);
  this_01 = (XmlWriter *)(in_RDI + 0xb0);
  local_a8 = operator____sr((char *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  local_b8 = AssertionResult::getTestMacroName(local_18);
  name_00.m_start._4_4_ = OVar2;
  name_00.m_start._0_4_ = in_stack_fffffffffffffe18;
  name_00.m_size = in_RDI;
  attribute_00.m_size = sVar4;
  attribute_00.m_start = (char *)this_00;
  XmlWriter::writeAttribute(this_01,name_00,attribute_00);
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffdc0);
  OVar3 = AssertionResult::getResultType(local_18);
  if (OVar3 == ExplicitSkip) {
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [9])in_stack_fffffffffffffdb8);
  }
  else {
    this_02 = (AssertionResult *)
              ReusableStringStream::operator<<
                        ((ReusableStringStream *)in_stack_fffffffffffffdc0,
                         (char (*) [7])in_stack_fffffffffffffdb8);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,
               (char (*) [3])in_stack_fffffffffffffdb8);
    bVar1 = AssertionResult::hasExpression((AssertionResult *)0x1a8a35);
    if (bVar1) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdc0,
                 (char (*) [3])in_stack_fffffffffffffdb8);
      AssertionResult::getExpressionInMacro_abi_cxx11_(this_00);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdc0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdb8);
      std::__cxx11::string::~string(local_e8);
      local_e9 = 10;
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8
                );
    }
    bVar1 = AssertionResult::hasExpandedExpression
                      ((AssertionResult *)CONCAT44(OVar2,in_stack_fffffffffffffe18));
    if (bVar1) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdc0,
                 (char (*) [17])in_stack_fffffffffffffdb8);
      AssertionResult::getExpandedExpression_abi_cxx11_(this_02);
      TextFlow::Column::Column
                ((Column *)in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8);
      TextFlow::Column::indent(&local_130,2);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      local_151 = 10;
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8
                );
      TextFlow::Column::~Column((Column *)0x1a8b95);
      std::__cxx11::string::~string(local_150);
    }
  }
  bVar1 = AssertionResult::hasMessage((AssertionResult *)0x1a8bfc);
  if (bVar1) {
    local_168 = AssertionResult::getMessage((AssertionResult *)0x1a8c0f);
    ReusableStringStream::operator<<(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    local_169 = 10;
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8);
  }
  local_178 = local_10 + 1;
  local_180._M_current =
       (MessageInfo *)
       std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                 ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                  in_stack_fffffffffffffdb8);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
             in_stack_fffffffffffffdb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                             *)in_stack_fffffffffffffdc0,
                            (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                             *)in_stack_fffffffffffffdb8), bVar1) {
    pMVar5 = __gnu_cxx::
             __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
             ::operator*(&local_180);
    if (pMVar5->type == Info) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdc0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdb8);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8
                );
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(&local_180);
  }
  ReusableStringStream::operator<<
            ((ReusableStringStream *)in_stack_fffffffffffffdc0,
             (char (*) [4])in_stack_fffffffffffffdb8);
  AssertionResult::getSourceInfo(local_18);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)in_stack_fffffffffffffdc0,
             (SourceLineInfo *)in_stack_fffffffffffffdb8);
  this_03 = (StringRef *)(in_RDI + 0xb0);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffdb8);
  StringRef::StringRef(this_03,(string *)in_stack_fffffffffffffdb8);
  XmlWriter::writeText
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,in_stack_fffffffffffffe3c);
  std::__cxx11::string::~string(local_1d8);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)this_01);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_03);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void JunitReporter::writeAssertion( AssertionStats const& stats ) {
        AssertionResult const& result = stats.assertionResult;
        if ( !result.isOk() ||
             result.getResultType() == ResultWas::ExplicitSkip ) {
            std::string elementName;
            switch( result.getResultType() ) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;
                case ResultWas::ExplicitSkip:
                    elementName = "skipped";
                    break;
                // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
            }

            XmlWriter::ScopedElement e = xml.scopedElement( elementName );

            xml.writeAttribute( "message"_sr, result.getExpression() );
            xml.writeAttribute( "type"_sr, result.getTestMacroName() );

            ReusableStringStream rss;
            if ( result.getResultType() == ResultWas::ExplicitSkip ) {
                rss << "SKIPPED\n";
            } else {
                rss << "FAILED" << ":\n";
                if (result.hasExpression()) {
                    rss << "  ";
                    rss << result.getExpressionInMacro();
                    rss << '\n';
                }
                if (result.hasExpandedExpression()) {
                    rss << "with expansion:\n";
                    rss << TextFlow::Column(result.getExpandedExpression()).indent(2) << '\n';
                }
            }

            if( result.hasMessage() )
                rss << result.getMessage() << '\n';
            for( auto const& msg : stats.infoMessages )
                if( msg.type == ResultWas::Info )
                    rss << msg.message << '\n';

            rss << "at " << result.getSourceInfo();
            xml.writeText( rss.str(), XmlFormatting::Newline );
        }
    }